

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorypool.h
# Opt level: O2

void __thiscall
despot::MemoryPool<despot::SimpleState>::Free
          (MemoryPool<despot::SimpleState> *this,SimpleState *obj)

{
  SimpleState *obj_local;
  
  obj_local = obj;
  if (obj->field_0x8 != '\0') {
    obj->field_0x8 = 0;
    std::vector<despot::SimpleState_*,_std::allocator<despot::SimpleState_*>_>::push_back
              (&this->freelist_,&obj_local);
    this->num_allocated_ = this->num_allocated_ + -1;
    return;
  }
  __assert_fail("obj->IsAllocated()",
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/include/despot/util/memorypool.h"
                ,0x3b,
                "void despot::MemoryPool<despot::SimpleState>::Free(T *) [T = despot::SimpleState]")
  ;
}

Assistant:

void Free(T* obj) {
		assert(obj->IsAllocated());
		obj->ClearAllocated();
		freelist_.push_back(obj);
		num_allocated_--;
	}